

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void request_handler_clbk(uint32_t cmd,char *data,uint32_t size)

{
  char cVar1;
  char *__s;
  allocator<char> local_31;
  string local_30;
  
  if (2 < size) {
    cVar1 = data[1];
    __s = "1";
    if (data[2] == '0') {
      __s = "0";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
    setLedState((GPIOClass *)(ledPool + (long)((short)(cVar1 + -0x30) % 2) * 0x20),&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void request_handler_clbk(uint32_t cmd, char const * data, uint32_t size) 
{    
	if(size > 2)
    {
        int led_i = int(data[1]-'0') % LEDS_CNT;
        setLedState(&ledPool[led_i], (data[2] != '0') ? LED_SET_STATE : LED_RESET_STATE);
    }
}